

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BankAccount.cpp
# Opt level: O1

void __thiscall L13_2::BankAccountPlus::view(BankAccountPlus *this)

{
  uint uVar1;
  undefined8 uVar2;
  long lVar3;
  ostream *poVar4;
  
  lVar3 = std::cout;
  uVar1 = *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18));
  *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
       uVar1 & 0xfffffefb | 4;
  uVar2 = *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(lVar3 + -0x18));
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(lVar3 + -0x18)) = 2;
  BankAccount::view(&this->super_BankAccount);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[BankAccountPlus] Maximum loan: $",0x21);
  poVar4 = std::ostream::_M_insert<double>(this->_max_loan);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[BankAccountPlus] Current loan: $",0x21);
  poVar4 = std::ostream::_M_insert<double>(this->_loan);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 3;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[BankAccountPlus] Rate: ",0x18);
  poVar4 = std::ostream::_M_insert<double>(this->_rate * 100.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%\n",2);
  lVar3 = std::cout;
  *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
       uVar1 & 0x104 |
       *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) &
       0xfffffefb;
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(lVar3 + -0x18)) = uVar2;
  return;
}

Assistant:

void BankAccountPlus::view() const {
        format initState = set_format();
        precis initPrec = cout.precision(2);

        //  Todo:
        BankAccount::view();
        cout << "[BankAccountPlus] Maximum loan: $" << _max_loan << endl;
        cout << "[BankAccountPlus] Current loan: $" << _loan << endl;
        cout.precision(3); // ###.###
        cout << "[BankAccountPlus] Rate: " << 100 * _rate << "%\n";

        reset_format(initState, initPrec);
    }